

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void __thiscall QString::QString(QString *this,qsizetype size,Initialization param_3)

{
  long lVar1;
  char16_t *pcVar2;
  undefined4 in_EDX;
  QArrayDataPointer<char16_t> *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb0;
  QArrayDataPointer<char16_t> *n;
  qsizetype in_stack_ffffffffffffffc8;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer(in_RDI);
  if ((long)in_RSI < 1) {
    QArrayDataPointer<char16_t>::fromRawData
              ((char16_t *)in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
    QArrayDataPointer<char16_t>::operator=
              (in_RSI,(QArrayDataPointer<char16_t> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(qsizetype)n,
               (AllocationOption)((ulong)in_RSI >> 0x20));
    QArrayDataPointer<char16_t>::operator=
              (in_RSI,(QArrayDataPointer<char16_t> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)CONCAT44(in_EDX,in_stack_ffffffffffffffb0));
    qt_noop();
    pcVar2 = QArrayDataPointer<char16_t>::data(in_RDI);
    pcVar2[(long)in_RSI] = L'\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QString::QString(qsizetype size, Qt::Initialization)
{
    if (size <= 0) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        d = DataPointer(size, size);
        Q_CHECK_PTR(d.data());
        d.data()[size] = '\0';
    }
}